

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_posix_file_impl.h
# Opt level: O1

int64_t default_write_func(exr_const_context_t_conflict ctxt,void *userdata,void *buffer,uint64_t sz
                          ,uint64_t offset,exr_stream_error_func_ptr_t error_cb)

{
  int __fd;
  ssize_t sVar1;
  int *piVar2;
  char *pcVar3;
  uint64_t uVar4;
  uint64_t __n;
  
  if (userdata == (void *)0x0) {
    if (error_cb == (exr_stream_error_func_ptr_t)0x0) {
      return -1;
    }
    pcVar3 = "Invalid file handle pointer";
  }
  else {
    __fd = *userdata;
    if (-1 < __fd) {
      uVar4 = 0;
      __n = sz;
      do {
        sVar1 = pwrite(__fd,buffer,__n,offset);
        if (sVar1 < 0) {
          piVar2 = __errno_location();
          if ((*piVar2 != 4) && (*piVar2 != 0xb)) {
            uVar4 = 0xffffffffffffffff;
            goto LAB_0011a05d;
          }
        }
        else {
          uVar4 = uVar4 + sVar1;
          buffer = (void *)((long)buffer + sVar1);
          __n = __n - sVar1;
          offset = offset + sVar1;
        }
        if ((long)sz <= (long)uVar4) {
LAB_0011a05d:
          if (error_cb == (exr_stream_error_func_ptr_t)0x0) {
            return uVar4;
          }
          if (uVar4 == sz) {
            return uVar4;
          }
          piVar2 = __errno_location();
          pcVar3 = strerror(*piVar2);
          (*error_cb)(ctxt,0xb,"Unable to write %lu bytes to stream, wrote %ld: %s",sz,uVar4,pcVar3)
          ;
          return uVar4;
        }
      } while( true );
    }
    if (error_cb == (exr_stream_error_func_ptr_t)0x0) {
      return -1;
    }
    pcVar3 = "Invalid file descriptor";
  }
  (*error_cb)(ctxt,3,pcVar3);
  return -1;
}

Assistant:

static int64_t
default_write_func (
    exr_const_context_t         ctxt,
    void*                       userdata,
    const void*                 buffer,
    uint64_t                    sz,
    uint64_t                    offset,
    exr_stream_error_func_ptr_t error_cb)
{
    int64_t                          rv, retsz = -1;
    struct _internal_exr_filehandle* fh      = userdata;
    int                              fd      = -1;
    const uint8_t*                   curbuf  = (const uint8_t*) buffer;
    uint64_t                         writesz = sz;

    if (sizeof (size_t) < sizeof (uint64_t))
    {
        if (sz >= (uint64_t) UINT32_MAX)
        {
            if (error_cb)
                error_cb (
                    ctxt,
                    EXR_ERR_INVALID_ARGUMENT,
                    "read request size too large for architecture");
            return retsz;
        }
    }

    if (!fh)
    {
        if (error_cb)
            error_cb (
                ctxt, EXR_ERR_INVALID_ARGUMENT, "Invalid file handle pointer");
        return retsz;
    }

    fd = fh->fd;
    if (fd < 0)
    {
        if (error_cb)
            error_cb (
                ctxt, EXR_ERR_INVALID_ARGUMENT, "Invalid file descriptor");
        return retsz;
    }

#if !CAN_USE_PREAD
#    ifdef ILMTHREAD_THREADING_ENABLED
    pthread_mutex_lock (&(fh->mutex));
#    endif
    {
#    if defined __USE_LARGEFILE64
        uint64_t spos = (uint64_t) lseek64 (fd, (off64_t) offset, SEEK_SET);
#    else
        uint64_t spos = (uint64_t) lseek (fd, (off_t) offset, SEEK_SET);
#    endif
        if (spos != offset)
        {
#    ifdef ILMTHREAD_THREADING_ENABLED
            pthread_mutex_unlock (&(fh->mutex));
#    endif
            if (error_cb)
            {
                if (spos == (uint64_t) -1)
                    error_cb (ctxt, EXR_ERR_WRITE_IO, strerror (errno));
                else
                    error_cb (
                        ctxt,
                        EXR_ERR_WRITE_IO,
                        "Unable to seek to requested position");
            }
            return retsz;
        }
    }
#endif

    retsz = 0;
    do
    {
#if CAN_USE_PREAD
        rv = pwrite (fd, curbuf, (size_t) writesz, (off_t) offset);
#else
        rv = write (fd, curbuf, (size_t) writesz);
#endif
        if (rv < 0)
        {
            if (errno == EINTR) continue;
            if (errno == EAGAIN) continue;
            retsz = -1;
            break;
        }
        retsz += rv;
        curbuf += rv;
        writesz -= (uint64_t) rv;
        offset += (uint64_t) rv;
    } while (retsz < (int64_t) sz);

#if !CAN_USE_PREAD
#    ifdef ILMTHREAD_THREADING_ENABLED
    pthread_mutex_unlock (&(fh->mutex));
#    endif
#endif
    if (retsz != (int64_t) sz && error_cb)
        error_cb (
            ctxt,
            EXR_ERR_WRITE_IO,
            "Unable to write %" PRIu64 " bytes to stream, wrote %" PRId64
            ": %s",
            sz,
            retsz,
            strerror (errno));
    return retsz;
}